

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

EmulatorEvent host_step(Host *host)

{
  EmulatorEvent event_00;
  Emulator *e_00;
  Ticks TVar1;
  EmulatorEvent event;
  Emulator *e;
  Host *host_local;
  
  if ((host->rewind_state).rewinding == FALSE) {
    e_00 = host_get_emulator(host);
    event_00 = emulator_step(e_00);
    host_handle_event(host,event_00);
    TVar1 = emulator_get_ticks(e_00);
    host->last_ticks = TVar1;
    return event_00;
  }
  __assert_fail("!host->rewind_state.rewinding",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x1c2,
                "EmulatorEvent host_step(Host *)");
}

Assistant:

EmulatorEvent host_step(Host* host) {
  assert(!host->rewind_state.rewinding);
  Emulator* e = host_get_emulator(host);
  EmulatorEvent event = emulator_step(e);
  host_handle_event(host, event);
  host->last_ticks = emulator_get_ticks(e);
  return event;
}